

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestDiscretizedArcLength.cpp
# Opt level: O0

bool ParseDiscretizedArcLength(string *sString)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  syntax_option_type __f;
  int iVar5;
  value_type *pvVar6;
  char *pcVar7;
  size_t sVar8;
  ostream *poVar9;
  undefined4 local_a8c;
  char local_a88 [8];
  char szBuffer [20];
  string local_a68;
  string local_a48;
  LLPOINT local_a28;
  double local_a18;
  double dDist2;
  string local_9f0;
  LLPOINT local_9d0;
  double local_9c0;
  double dDist1;
  int nSegments;
  regex_error *e;
  string_type local_920;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_900;
  string_type local_878;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_858;
  string_type local_7d0;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_7b0;
  string_type local_728;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_708;
  string_type local_680;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_660;
  string_type local_5d8;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_5b8;
  string_type local_530;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_510;
  string_type local_488;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_468;
  string_type local_3e0;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_3c0;
  string_type local_338;
  undefined1 local_318 [8];
  sregex_token_iterator s_end;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_288;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_280;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_278;
  undefined1 local_270 [8];
  sregex_token_iterator it;
  int sub_matches [10];
  regex pat;
  undefined1 local_198 [8];
  string sRxPat;
  string local_160 [4];
  syntax_option_type flags;
  string sDifference;
  string sDirectComputedArcLength;
  string sComputedArcLength;
  string sDirection;
  string sEndAz;
  string sStartAz;
  string sArcRadius;
  string sArcCenterLong;
  string sArcCenterLat;
  string sTestId;
  bool bPassed;
  string *sString_local;
  
  sTestId.field_2._M_local_buf[0xf] = '\x01';
  trim(sString," \t\n\r\f\v");
  std::__cxx11::string::string((string *)(sArcCenterLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sArcCenterLong.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sArcRadius.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sStartAz.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sEndAz.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sDirection.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sComputedArcLength.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sDirectComputedArcLength.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sDifference.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_160);
  __f = std::regex_constants::operator|(1,0x10);
  local_a8c = __f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_198,"([a-z]*|[A-Z]*\\d*)[,]",
             (allocator *)
             ((long)&pat._M_automaton.
                     super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pat._M_automaton.
                     super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::__cxx11::string::operator+=
            ((string *)local_198,
             "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]")
  ;
  std::__cxx11::string::operator+=
            ((string *)local_198,
             "([-+]?[0-9]*[.]?[0-9]+)[,]([-+]?[0-9]*[.]?[0-9]+)[,]([-+]?[0-9]*[.]?[0-9]+)[,]");
  std::__cxx11::string::operator+=((string *)local_198,"([-+]?[1])[,]");
  std::__cxx11::string::operator+=
            ((string *)local_198,"([-+]?[0-9]*[.]?[0-9]+)[,]([-+]?[0-9]*[.]?[0-9]+)[,]");
  std::__cxx11::string::operator+=((string *)local_198,"(.*)");
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)(sub_matches + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,__f);
  sub_matches[2] = 5;
  sub_matches[3] = 6;
  sub_matches[4] = 7;
  sub_matches[5] = 8;
  it._M_has_m1 = true;
  it._129_7_ = 0x2000000;
  sub_matches[0] = 3;
  sub_matches[1] = 4;
  sub_matches[6] = 9;
  sub_matches[7] = 10;
  local_280._M_current = (char *)std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_278,&local_280);
  s_end._128_8_ = std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_288,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&s_end._M_has_m1);
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
  ::regex_token_iterator<10ul>
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
              *)local_270,local_278,local_288,(regex_type *)(sub_matches + 8),
             (int (*) [10])&it._M_has_m1,0);
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::regex_token_iterator
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
              *)local_318);
  bVar4 = std::__cxx11::
          regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
          ::operator!=((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                        *)local_270,
                       (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                        *)local_318);
  if (bVar4) {
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_3c0,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_270,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_3c0);
    std::__cxx11::sub_match::operator_cast_to_string(&local_338,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)(sArcCenterLat.field_2._M_local_buf + 8),(string *)&local_338);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_3c0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_468,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_270,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_468);
    std::__cxx11::sub_match::operator_cast_to_string(&local_3e0,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)(sArcCenterLong.field_2._M_local_buf + 8),(string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_468);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_510,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_270,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_510);
    std::__cxx11::sub_match::operator_cast_to_string(&local_488,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)(sArcRadius.field_2._M_local_buf + 8),(string *)&local_488);
    std::__cxx11::string::~string((string *)&local_488);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_510);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_5b8,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_270,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_5b8);
    std::__cxx11::sub_match::operator_cast_to_string(&local_530,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)(sStartAz.field_2._M_local_buf + 8),(string *)&local_530);
    std::__cxx11::string::~string((string *)&local_530);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_5b8);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_660,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_270,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_660);
    std::__cxx11::sub_match::operator_cast_to_string(&local_5d8,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)(sEndAz.field_2._M_local_buf + 8),(string *)&local_5d8);
    std::__cxx11::string::~string((string *)&local_5d8);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_660);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_708,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_270,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_708);
    std::__cxx11::sub_match::operator_cast_to_string(&local_680,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)(sDirection.field_2._M_local_buf + 8),(string *)&local_680);
    std::__cxx11::string::~string((string *)&local_680);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_708);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_7b0,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_270,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_7b0);
    std::__cxx11::sub_match::operator_cast_to_string(&local_728,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)(sComputedArcLength.field_2._M_local_buf + 8),(string *)&local_728);
    std::__cxx11::string::~string((string *)&local_728);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_7b0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_858,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_270,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_858);
    std::__cxx11::sub_match::operator_cast_to_string(&local_7d0,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)(sDirectComputedArcLength.field_2._M_local_buf + 8),(string *)&local_7d0);
    std::__cxx11::string::~string((string *)&local_7d0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_858);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_900,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_270,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_900);
    std::__cxx11::sub_match::operator_cast_to_string(&local_878,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)(sDifference.field_2._M_local_buf + 8),(string *)&local_878);
    std::__cxx11::string::~string((string *)&local_878);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_900);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&e,(regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                        *)local_270,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                          *)&e);
    std::__cxx11::sub_match::operator_cast_to_string(&local_920,(sub_match *)pvVar6);
    std::__cxx11::string::operator=(local_160,(string *)&local_920);
    std::__cxx11::string::~string((string *)&local_920);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&e);
  }
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::~regex_token_iterator
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
              *)local_318);
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::~regex_token_iterator
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
              *)local_270);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)(sub_matches + 8));
  std::__cxx11::string::~string((string *)local_198);
  dDist1._0_4_ = 0x10;
  std::__cxx11::string::string
            ((string *)&local_9f0,(string *)(sArcCenterLong.field_2._M_local_buf + 8));
  dVar1 = ParseLatitude(&local_9f0);
  dVar1 = Deg2Rad(dVar1);
  std::__cxx11::string::string((string *)&dDist2,(string *)(sArcRadius.field_2._M_local_buf + 8));
  dVar2 = ParseLongitude((string *)&dDist2);
  dVar2 = Deg2Rad(dVar2);
  GeoCalcs::LLPOINT::LLPOINT(&local_9d0,dVar1,dVar2);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  dVar1 = atof(pcVar7);
  dVar1 = NmToMeters(dVar1);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  dVar2 = atof(pcVar7);
  dVar2 = Deg2Rad(dVar2);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  dVar3 = atof(pcVar7);
  dVar3 = Deg2Rad(dVar3);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  iVar5 = atoi(pcVar7);
  dVar1 = GeoCalcs::DiscretizedArcLength(&local_9d0,dVar1,dVar2,dVar3,iVar5,dDist1._0_4_,1e-09);
  std::__cxx11::string::~string((string *)&dDist2);
  std::__cxx11::string::~string((string *)&local_9f0);
  local_9c0 = dVar1;
  local_9c0 = MetersToNm(dVar1);
  std::__cxx11::string::string
            ((string *)&local_a48,(string *)(sArcCenterLong.field_2._M_local_buf + 8));
  dVar1 = ParseLatitude(&local_a48);
  dVar1 = Deg2Rad(dVar1);
  std::__cxx11::string::string((string *)&local_a68,(string *)(sArcRadius.field_2._M_local_buf + 8))
  ;
  dVar2 = ParseLongitude(&local_a68);
  dVar2 = Deg2Rad(dVar2);
  GeoCalcs::LLPOINT::LLPOINT(&local_a28,dVar1,dVar2);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  dVar1 = atof(pcVar7);
  dVar1 = NmToMeters(dVar1);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  dVar2 = atof(pcVar7);
  dVar2 = Deg2Rad(dVar2);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  dVar3 = atof(pcVar7);
  dVar3 = Deg2Rad(dVar3);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  iVar5 = atoi(pcVar7);
  dVar1 = GeoCalcs::DirectArcLength(&local_a28,dVar1,dVar2,dVar3,iVar5,1e-09);
  std::__cxx11::string::~string((string *)&local_a68);
  std::__cxx11::string::~string((string *)&local_a48);
  local_a18 = dVar1;
  local_a18 = MetersToNm(dVar1);
  sprintf(local_a88,"%07.6f",SUB84(local_9c0,0));
  iVar5 = std::__cxx11::string::compare(sDirectComputedArcLength.field_2._M_local_buf + 8);
  if (iVar5 != 0) {
    sVar8 = strlen(local_a88);
    if (local_a88[sVar8 - 1] == '0') {
      sVar8 = strlen(local_a88);
      local_a88[sVar8 - 1] = '\0';
    }
    iVar5 = std::__cxx11::string::compare(sDirectComputedArcLength.field_2._M_local_buf + 8);
    dVar1 = local_9c0;
    if (iVar5 != 0) {
      pcVar7 = (char *)std::__cxx11::string::c_str();
      dVar2 = atof(pcVar7);
      sTestId.field_2._M_local_buf[0xf] = IsApprox(dVar1,dVar2,5e-09);
      if ((bool)sTestId.field_2._M_local_buf[0xf]) {
        poVar9 = std::operator<<((ostream *)&std::cout,"\n");
        poVar9 = std::operator<<(poVar9,(string *)(sArcCenterLat.field_2._M_local_buf + 8));
        poVar9 = std::operator<<(poVar9,
                                 " within rounding tolerance of 0.5e-8: Input Computed Arc Length: "
                                );
        poVar9 = std::operator<<(poVar9,(string *)
                                        (sDirectComputedArcLength.field_2._M_local_buf + 8));
        poVar9 = std::operator<<(poVar9,"  calced: ");
        std::operator<<(poVar9,local_a88);
      }
      else {
        poVar9 = std::operator<<((ostream *)&std::cout,"\n");
        poVar9 = std::operator<<(poVar9,(string *)(sArcCenterLat.field_2._M_local_buf + 8));
        poVar9 = std::operator<<(poVar9," failed: Expected Computed Arc Length: ");
        poVar9 = std::operator<<(poVar9,(string *)
                                        (sDirectComputedArcLength.field_2._M_local_buf + 8));
        poVar9 = std::operator<<(poVar9,"  calced: ");
        std::operator<<(poVar9,local_a88);
      }
    }
  }
  sprintf(local_a88,"%07.6f",SUB84(local_a18,0));
  iVar5 = std::__cxx11::string::compare(sDifference.field_2._M_local_buf + 8);
  if (iVar5 != 0) {
    sVar8 = strlen(local_a88);
    if (local_a88[sVar8 - 1] == '0') {
      sVar8 = strlen(local_a88);
      local_a88[sVar8 - 1] = '\0';
    }
    iVar5 = std::__cxx11::string::compare(sDifference.field_2._M_local_buf + 8);
    dVar1 = local_9c0;
    if (iVar5 != 0) {
      pcVar7 = (char *)std::__cxx11::string::c_str();
      dVar2 = atof(pcVar7);
      bVar4 = IsApprox(dVar1,dVar2,5e-09);
      if (bVar4) {
        poVar9 = std::operator<<((ostream *)&std::cout,"\n");
        poVar9 = std::operator<<(poVar9,(string *)(sArcCenterLat.field_2._M_local_buf + 8));
        poVar9 = std::operator<<(poVar9,
                                 " within rounding tolerance of 0.5e-8: Input Direct Computed Arc Length: "
                                );
        poVar9 = std::operator<<(poVar9,(string *)(sDifference.field_2._M_local_buf + 8));
        poVar9 = std::operator<<(poVar9,"  calced: ");
        std::operator<<(poVar9,local_a88);
      }
      else {
        poVar9 = std::operator<<((ostream *)&std::cout,"\n");
        poVar9 = std::operator<<(poVar9,(string *)(sArcCenterLat.field_2._M_local_buf + 8));
        poVar9 = std::operator<<(poVar9," failed: Expected Direct Computed Arc Length: ");
        poVar9 = std::operator<<(poVar9,(string *)(sDifference.field_2._M_local_buf + 8));
        poVar9 = std::operator<<(poVar9,"  calced: ");
        std::operator<<(poVar9,local_a88);
        sTestId.field_2._M_local_buf[0xf] = '\0';
      }
    }
  }
  dDist1._4_4_ = 1;
  std::__cxx11::string::~string(local_160);
  std::__cxx11::string::~string((string *)(sDifference.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sDirectComputedArcLength.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sComputedArcLength.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sDirection.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sEndAz.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sStartAz.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sArcRadius.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sArcCenterLong.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sArcCenterLat.field_2._M_local_buf + 8));
  return (bool)sTestId.field_2._M_local_buf[0xf];
}

Assistant:

bool ParseDiscretizedArcLength(string sString)
{
    bool bPassed = true;
    trim(sString);
    string sTestId, sArcCenterLat, sArcCenterLong, sArcRadius;
    string sStartAz, sEndAz, sDirection, sComputedArcLength;
    string sDirectComputedArcLength, sDifference;

    try
    {
        regex_constants::syntax_option_type flags = regex_constants::icase | regex_constants::ECMAScript;

        string sRxPat = "([a-z]*|[A-Z]*\\d*)[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([-+]?[0-9]*[.]?[0-9]+)[,]([-+]?[0-9]*[.]?[0-9]+)[,]([-+]?[0-9]*[.]?[0-9]+)[,]";
        sRxPat += "([-+]?[1])[,]";
        sRxPat += "([-+]?[0-9]*[.]?[0-9]+)[,]([-+]?[0-9]*[.]?[0-9]+)[,]";
        sRxPat += "(.*)";
        regex pat(sRxPat, flags);
        int const sub_matches[] = {1, 2, 3, 4, 5, 6, 7, 8, 9, 10,};
        sregex_token_iterator it(sString.begin(), sString.end(), pat, sub_matches);
        sregex_token_iterator s_end;
        if (it != s_end)
        {
            sTestId = *it++;
            sArcCenterLat = *it++;
            sArcCenterLong = *it++;
            sArcRadius = *it++;
            sStartAz = *it++;
            sEndAz = *it++;
            sDirection = *it++;
            sComputedArcLength = *it++;
            sDirectComputedArcLength = *it++;
            sDifference = *it++;
        }
    }
    catch (regex_error &e)
    {
        cout << "\n" << e.what();
        return false;
    }


    int nSegments = 16;
    double dDist1 = DiscretizedArcLength(
            LLPoint(Deg2Rad(ParseLatitude(sArcCenterLat)), Deg2Rad(ParseLongitude(sArcCenterLong))),
            NmToMeters(atof(sArcRadius.c_str())), Deg2Rad(atof(sStartAz.c_str())), Deg2Rad(atof(sEndAz.c_str())),
            atoi(sDirection.c_str()), nSegments, kTol);
    dDist1 = MetersToNm(dDist1);


    double dDist2 = DirectArcLength(
            LLPoint(Deg2Rad(ParseLatitude(sArcCenterLat)), Deg2Rad(ParseLongitude(sArcCenterLong))),
            NmToMeters(atof(sArcRadius.c_str())), Deg2Rad(atof(sStartAz.c_str())), Deg2Rad(atof(sEndAz.c_str())),
            atoi(sDirection.c_str()), kTol);
    dDist2 = MetersToNm(dDist2);

    //  double dError = dDist2 - dDist1;

    char szBuffer[20];
    sprintf(szBuffer, "%07.6f", dDist1);
    if (sComputedArcLength.compare(szBuffer) != 0)
    {
        if (szBuffer[strlen(szBuffer) - 1] == '0')
        {
            szBuffer[strlen(szBuffer) - 1] = '\0';
        }
        if (sComputedArcLength.compare(szBuffer) != 0)
        {
            if (IsApprox(dDist1, atof(sComputedArcLength.c_str()), 0.5e-8))
            {
                cout << "\n" << sTestId << " within rounding tolerance of 0.5e-8: Input Computed Arc Length: " <<
                sComputedArcLength << "  calced: " << szBuffer;
            }
            else
            {
                cout << "\n" << sTestId << " failed: Expected Computed Arc Length: " << sComputedArcLength <<
                "  calced: " << szBuffer;
                bPassed = false;
            }
        }

    }

    sprintf(szBuffer, "%07.6f", dDist2);
    if (sDirectComputedArcLength.compare(szBuffer) != 0)
    {
        if (szBuffer[strlen(szBuffer) - 1] == '0')
        {
            szBuffer[strlen(szBuffer) - 1] = '\0';
        }
        if (sDirectComputedArcLength.compare(szBuffer) != 0)
        {
            if (IsApprox(dDist1, atof(sComputedArcLength.c_str()), 0.5e-8))
            {
                cout << "\n" << sTestId << " within rounding tolerance of 0.5e-8: Input Direct Computed Arc Length: " <<
                sDirectComputedArcLength << "  calced: " << szBuffer;
            }
            else
            {
                cout << "\n" << sTestId << " failed: Expected Direct Computed Arc Length: " <<
                sDirectComputedArcLength << "  calced: " << szBuffer;
                bPassed = false;
            }
        }
    }
    return bPassed;
}